

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ProgramActiveUniformNameCase::test
          (ProgramActiveUniformNameCase *this)

{
  ostringstream *this_00;
  int *piVar1;
  TestContext *pTVar2;
  ApiCase *pAVar3;
  GLuint GVar4;
  GLuint shader;
  GLuint program;
  int iVar5;
  long lVar6;
  CallLogWrapper *this_01;
  GLuint uniformIndex;
  ApiCase *local_a28;
  GLint size;
  allocator<char> local_a15;
  GLenum type;
  GLuint local_a10;
  GLuint local_a0c;
  long local_a08;
  CallLogWrapper *local_a00;
  char *uniformNames [3];
  StateQueryMemoryWriteGuard<unsigned_int[3]> uniformIndices;
  StateQueryMemoryWriteGuard<int> uniformNameLen;
  char buffer [2048];
  
  this_01 = &(this->super_ApiCase).super_CallLogWrapper;
  GVar4 = glu::CallLogWrapper::glCreateShader(this_01,0x8b31);
  shader = glu::CallLogWrapper::glCreateShader(this_01,0x8b30);
  glu::CallLogWrapper::glShaderSource(this_01,GVar4,1,&test::testVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource(this_01,shader,1,&test::testFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_01,GVar4);
  glu::CallLogWrapper::glCompileShader(this_01,shader);
  ApiCase::expectError(&this->super_ApiCase,0);
  program = glu::CallLogWrapper::glCreateProgram(this_01);
  glu::CallLogWrapper::glAttachShader(this_01,program,GVar4);
  local_a0c = shader;
  glu::CallLogWrapper::glAttachShader(this_01,program,shader);
  glu::CallLogWrapper::glLinkProgram(this_01,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_01,program,0x8b86,3);
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  local_a28 = &this->super_ApiCase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)buffer,"uniformNameWithLength23",(allocator<char> *)&uniformNameLen);
  local_a10 = GVar4;
  verifyProgramParam(pTVar2,this_01,program,0x8b87,buffer._8_4_ + 1);
  std::__cxx11::string::~string((string *)buffer);
  pAVar3 = local_a28;
  ApiCase::expectError(local_a28,0);
  uniformNames[2] = "uniformMat4";
  uniformNames[0] = "uniformNameWithLength23";
  uniformNames[1] = "uniformVec2";
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int[3]>::StateQueryMemoryWriteGuard
            (&uniformIndices);
  glu::CallLogWrapper::glGetUniformIndices(this_01,program,3,uniformNames,uniformIndices.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int[3]>::verifyValidity
            (&uniformIndices,(pAVar3->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  this_00 = (ostringstream *)(buffer + 8);
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    uniformIndex = uniformIndices.m_value[lVar6];
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              (&uniformNameLen);
    glu::CallLogWrapper::glGetActiveUniformsiv
              (this_01,program,1,&uniformIndex,0x8a39,&uniformNameLen.m_value);
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
              (&uniformNameLen,(local_a28->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)buffer,uniformNames[lVar6],(allocator<char> *)&size);
    iVar5 = buffer._8_4_ + 1;
    std::__cxx11::string::~string((string *)buffer);
    if (iVar5 != uniformNameLen.m_value) {
      buffer._0_8_ = ((local_a28->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"// ERROR: Expected ");
      std::ostream::operator<<(this_00,iVar5);
      std::operator<<((ostream *)this_00,"got ");
      std::ostream::operator<<(this_00,uniformNameLen.m_value);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      pTVar2 = (local_a28->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"got wrong uniform name length");
      }
    }
  }
  lVar6 = 0;
  local_a00 = this_01;
  while( true ) {
    if (lVar6 == 3) break;
    memset(buffer,0,0x800);
    uniformIndex = 0;
    buffer[0] = 'x';
    size = 0;
    GVar4 = uniformIndices.m_value[lVar6];
    type = 0;
    glu::CallLogWrapper::glGetActiveUniform
              (this_01,program,GVar4,0x800,(GLsizei *)&uniformIndex,&size,&type,buffer);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&uniformNameLen,uniformNames[lVar6],&local_a15);
    iVar5 = uniformNameLen.m_postguard;
    std::__cxx11::string::~string((string *)&uniformNameLen);
    if (uniformIndex != iVar5) {
      uniformNameLen._0_8_ =
           ((local_a28->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      piVar1 = &uniformNameLen.m_postguard;
      local_a08 = lVar6;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)piVar1);
      std::operator<<((ostream *)piVar1,"// ERROR: Expected ");
      std::ostream::operator<<(piVar1,iVar5);
      std::operator<<((ostream *)piVar1,"got ");
      std::ostream::operator<<(piVar1,uniformIndex);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&uniformNameLen,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)piVar1);
      lVar6 = local_a08;
      pTVar2 = (local_a28->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"got wrong uniform name length");
      }
    }
    this_01 = local_a00;
    uniformIndex = 0;
    glu::CallLogWrapper::glGetActiveUniform
              (local_a00,program,GVar4,1,(GLsizei *)&uniformIndex,&size,&type,buffer);
    if (uniformIndex != 0) {
      uniformNameLen._0_8_ =
           ((local_a28->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      piVar1 = &uniformNameLen.m_postguard;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)piVar1);
      std::operator<<((ostream *)piVar1,"// ERROR: Expected 0 got ");
      std::ostream::operator<<(piVar1,uniformIndex);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&uniformNameLen,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)piVar1);
      pTVar2 = (local_a28->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"got wrong uniform name length");
      }
    }
    lVar6 = lVar6 + 1;
  }
  glu::CallLogWrapper::glDeleteShader(this_01,local_a10);
  glu::CallLogWrapper::glDeleteShader(this_01,local_a0c);
  glu::CallLogWrapper::glDeleteProgram(this_01,program);
  ApiCase::expectError(local_a28,0);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		static const char* testVertSource =
			"#version 300 es\n"
			"uniform highp float uniformNameWithLength23;\n"
			"uniform highp vec2 uniformVec2;\n"
			"uniform highp mat4 uniformMat4;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(0.0) + vec4(uniformNameWithLength23) + vec4(uniformVec2.x) + vec4(uniformMat4[2][3]);\n"
			"}\n\0";
		static const char* testFragSource =
			"#version 300 es\n"
			"layout(location = 0) out mediump vec4 fragColor;"
			"void main (void)\n"
			"{\n"
			"	fragColor = vec4(0.0);\n"
			"}\n\0";

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &testVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &testFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);
		expectError(GL_NO_ERROR);

		verifyProgramParam(m_testCtx, *this, program, GL_ACTIVE_UNIFORMS, 3);
		verifyProgramParam(m_testCtx, *this, program, GL_ACTIVE_UNIFORM_MAX_LENGTH, (GLint)std::string("uniformNameWithLength23").length() + 1); // including a null terminator
		expectError(GL_NO_ERROR);

		const char* uniformNames[] =
		{
			"uniformNameWithLength23",
			"uniformVec2",
			"uniformMat4"
		};
		StateQueryMemoryWriteGuard<GLuint[DE_LENGTH_OF_ARRAY(uniformNames)]> uniformIndices;
		glGetUniformIndices(program, DE_LENGTH_OF_ARRAY(uniformNames), uniformNames, uniformIndices);
		uniformIndices.verifyValidity(m_testCtx);

		// check name lengths
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(uniformNames); ++ndx)
		{
			const GLuint uniformIndex = uniformIndices[ndx];

			StateQueryMemoryWriteGuard<GLint> uniformNameLen;
			glGetActiveUniformsiv(program, 1, &uniformIndex, GL_UNIFORM_NAME_LENGTH, &uniformNameLen);

			uniformNameLen.verifyValidity(m_testCtx);

			const GLint referenceLength = (GLint)std::string(uniformNames[ndx]).length() + 1;
			if (referenceLength != uniformNameLen) // uniformNameLen is with null terminator
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected " << referenceLength << "got " << uniformNameLen << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong uniform name length");
			}
		}

		// check names
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(uniformNames); ++ndx)
		{
			char buffer[2048] = {'x'};

			const GLuint uniformIndex = uniformIndices[ndx];

			GLint written = 0; // null terminator not included
			GLint size = 0;
			GLenum type = 0;
			glGetActiveUniform(program, uniformIndex, DE_LENGTH_OF_ARRAY(buffer), &written, &size, &type, buffer);

			const GLint referenceLength = (GLint)std::string(uniformNames[ndx]).length();
			if (referenceLength != written)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected " << referenceLength << "got " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong uniform name length");
			}

			// and with too small buffer
			written = 0;
			glGetActiveUniform(program, uniformIndex, 1, &written, &size, &type, buffer);

			if (written != 0)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected 0 got " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong uniform name length");
			}
		}


		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}